

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoViableAltForCharException.cpp
# Opt level: O2

string * __thiscall
antlr::NoViableAltForCharException::getMessage_abi_cxx11_
          (string *__return_storage_ptr__,NoViableAltForCharException *this)

{
  int ch;
  allocator<char> local_51;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"unexpected char: ",&local_51);
  charName_abi_cxx11_(&local_50,(antlr *)(ulong)(uint)this->foundChar,ch);
  std::operator+(__return_storage_ptr__,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string NoViableAltForCharException::getMessage() const
{
	return ANTLR_USE_NAMESPACE(std)string("unexpected char: ")+charName(foundChar);
}